

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void ge_equals_ge(secp256k1_ge *a,secp256k1_ge *b)

{
  int iVar1;
  secp256k1_ge *a_00;
  
  if (a->infinity == b->infinity) {
    if (a->infinity != 0) {
      return;
    }
    a_00 = a;
    iVar1 = secp256k1_fe_equal_var(&a->x,&b->x);
    if (iVar1 != 0) {
      a_00 = (secp256k1_ge *)&a->y;
      iVar1 = secp256k1_fe_equal_var((secp256k1_fe *)a_00,&b->y);
      if (iVar1 != 0) {
        return;
      }
      goto LAB_00128923;
    }
  }
  else {
    ge_equals_ge_cold_1();
    a_00 = a;
  }
  ge_equals_ge_cold_3();
LAB_00128923:
  ge_equals_ge_cold_2();
  secp256k1_testrand_bytes_test((uchar *)a_00,0x20);
  return;
}

Assistant:

static void ge_equals_ge(const secp256k1_ge *a, const secp256k1_ge *b) {
    CHECK(a->infinity == b->infinity);
    if (a->infinity) {
        return;
    }
    CHECK(secp256k1_fe_equal_var(&a->x, &b->x));
    CHECK(secp256k1_fe_equal_var(&a->y, &b->y));
}